

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O1

void spell_summon(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  CHAR_DATA *ch_00;
  char *txt;
  CHAR_DATA *victim;
  CHAR_DATA *local_68;
  CHAR_DATA *local_60;
  string local_58;
  string local_38;
  
  local_60 = ch;
  local_68 = get_char_world(ch,target_name);
  if (((local_68 != (CHAR_DATA *)0x0) && (local_68 != local_60)) &&
     (local_68->in_room != (ROOM_INDEX_DATA *)0x0)) {
    bVar1 = is_npc(local_68);
    if (((bVar1) || (local_68->in_room->area == local_60->in_room->area)) &&
       (((local_60->in_room->room_flags[0] & 0x400400) == 0 &&
        ((local_60->in_room->guild == 0 && (local_68->in_room->guild == 0)))))) {
      bVar1 = is_npc(local_68);
      if (bVar1) {
        bVar1 = is_affected_by(local_68,0x12);
        if ((bVar1) && (local_68->in_room->area != local_60->in_room->area)) goto LAB_002b6222;
      }
      if ((local_68->in_room->room_flags[0] & 0x800e00) == 0) {
        bVar1 = is_npc(local_68);
        if ((!bVar1) || ((local_68->act[0] & 0x20) == 0)) {
          bVar1 = is_npc(local_68);
          if ((!bVar1) || ((int)local_68->level < level + 10)) {
            bVar1 = is_npc(local_68);
            if ((!bVar1) && (0x33 < local_68->level)) {
              bVar1 = is_immortal(local_60);
              if (!bVar1) goto LAB_002b6222;
            }
            if (local_68->fighting == (CHAR_DATA *)0x0) {
              bVar1 = is_npc(local_68);
              if ((!bVar1) || ((local_68->imm_flags[0] & 1) == 0)) {
                bVar1 = is_npc(local_68);
                if ((!bVar1) || (local_68->pIndexData->pShop == (SHOP_DATA *)0x0)) {
                  bVar1 = is_npc(local_68);
                  if ((!bVar1) || ((local_68->act[0] & 0x20) == 0)) {
                    bVar1 = is_npc(local_68);
                    if (!bVar1) {
                      bVar1 = can_pk(local_60,local_68);
                      if ((!bVar1) && ((local_68->act[0] & 0x10000) != 0)) goto LAB_002b6222;
                    }
                    bVar1 = can_see(local_60,local_68);
                    if (bVar1) {
                      bVar1 = is_explore(local_60->in_room);
                      if (!bVar1) {
                        bVar1 = is_explore(local_68->in_room);
                        if (!bVar1) {
                          bVar1 = is_affected(local_68,(int)gsn_bind_feet);
                          if (!bVar1) {
                            bVar1 = is_affected_by(local_60,0xe);
                            if (!bVar1) {
                              bVar1 = saves_spell(level + 1,local_68,0x10);
                              if (bVar1) {
                                act("$N resisted your summoning.",local_60,(void *)0x0,local_68,3);
                                bVar1 = saves_spell(level + -1,local_68,0x10);
                                if (bVar1) {
                                  txt = "You feel a strange wrenching sensation, but it passes.\n\r"
                                  ;
                                  ch_00 = local_68;
                                  goto LAB_002b622e;
                                }
                              }
                              else {
                                local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_38,"spell_summon","");
                                local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_58,"summon_char","");
                                CQueue::
                                AddToQueue<void(*)(char_data*,char_data*),char_data*&,char_data*&>
                                          (&RS.Queue,3,&local_38,&local_58,summon_char,&local_60,
                                           &local_68);
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                                  operator_delete(local_58._M_dataplus._M_p,
                                                  local_58.field_2._M_allocated_capacity + 1);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_38._M_dataplus._M_p != &local_38.field_2) {
                                  operator_delete(local_38._M_dataplus._M_p,
                                                  local_38.field_2._M_allocated_capacity + 1);
                                }
                                act("You begin the summoning of $N.",local_60,(void *)0x0,local_68,3
                                   );
                                bVar1 = saves_spell(level,local_68,0x10);
                                if (bVar1) {
                                  send_to_char("You feel a strange wrenching sensation at the very core of your being.\n\r"
                                               ,local_68);
                                }
                              }
                              return;
                            }
                            txt = "You lack the concentration to summon while in a rage.\n\r";
                            ch_00 = local_60;
                            goto LAB_002b622e;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_002b6222:
  txt = "You failed.\n\r";
  ch_00 = local_60;
LAB_002b622e:
  send_to_char(txt,ch_00);
  return;
}

Assistant:

void spell_summon(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim;

	victim = get_char_world(ch, target_name);

	if (victim == nullptr
		|| victim == ch
		|| victim->in_room == nullptr
		|| (!is_npc(victim) && victim->in_room->area != ch->in_room->area)
		|| IS_SET(ch->in_room->room_flags, ROOM_SAFE)
		|| IS_SET(ch->in_room->room_flags, ROOM_NO_SUMMON_TO)
		|| ch->in_room->guild != 0
		|| victim->in_room->guild != 0
		|| (is_npc(victim) && is_affected_by(victim, AFF_CHARM) && victim->in_room->area != ch->in_room->area)
		|| IS_SET(victim->in_room->room_flags, ROOM_SAFE)
		|| IS_SET(victim->in_room->room_flags, ROOM_PRIVATE)
		|| IS_SET(victim->in_room->room_flags, ROOM_SOLITARY)
		|| IS_SET(victim->in_room->room_flags, ROOM_NO_SUMMON_FROM)
		|| (is_npc(victim) && IS_SET(victim->act, ACT_AGGRESSIVE))
		|| (is_npc(victim) && victim->level >= (level + 10))
		|| (!is_npc(victim) && victim->level >= LEVEL_IMMORTAL && !is_immortal(ch))
		|| victim->fighting != nullptr
		|| (is_npc(victim) && IS_SET(victim->imm_flags, IMM_SUMMON))
		|| (is_npc(victim) && victim->pIndexData->pShop != nullptr)
		|| (is_npc(victim) && IS_SET(victim->act, ACT_AGGRESSIVE))
		|| (!is_npc(victim) && !can_pk(ch, victim) && IS_SET(victim->act, PLR_NOSUMMON))
		|| !can_see(ch, victim)
		|| is_explore(ch->in_room)
		|| is_explore(victim->in_room)
		|| is_affected(victim, gsn_bind_feet))
	{
		send_to_char("You failed.\n\r", ch);
		return;
	}

	if (is_affected_by(ch, AFF_RAGE))
	{
		send_to_char("You lack the concentration to summon while in a rage.\n\r", ch);
		return;
	}

	if (saves_spell(level + 1, victim, DAM_OTHER))
	{
		act("$N resisted your summoning.", ch, 0, victim, TO_CHAR);

		if (saves_spell(level - 1, victim, DAM_OTHER))
			send_to_char("You feel a strange wrenching sensation, but it passes.\n\r", victim);

		return;
	}

	RS.Queue.AddToQueue(3, "spell_summon", "summon_char", summon_char, ch, victim);

	act("You begin the summoning of $N.", ch, 0, victim, TO_CHAR);

	if (saves_spell(level, victim, DAM_OTHER))
		send_to_char("You feel a strange wrenching sensation at the very core of your being.\n\r", victim);
}